

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmTargetTraceDependencies::IsUtility(cmTargetTraceDependencies *this,string *dep)

{
  bool bVar1;
  __type _Var2;
  TargetType TVar3;
  cmGeneratorTarget *this_00;
  string tLocation;
  string depLocation;
  string util;
  string local_40;
  
  cmsys::SystemTools::GetFilenameName(&util,dep);
  cmsys::SystemTools::GetFilenameLastExtension(&tLocation,&util);
  bVar1 = std::operator==(&tLocation,".exe");
  std::__cxx11::string::~string((string *)&tLocation);
  if (bVar1) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&tLocation,&util);
    std::__cxx11::string::operator=((string *)&util,(string *)&tLocation);
    std::__cxx11::string::~string((string *)&tLocation);
  }
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->GeneratorTarget->LocalGenerator,&util);
  if (this_00 != (cmGeneratorTarget *)0x0) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(dep);
    if (!bVar1) {
      bVar1 = true;
      cmTarget::AddUtility(this->GeneratorTarget->Target,&util,true,(cmMakefile *)0x0);
      goto LAB_0033ca47;
    }
    TVar3 = cmGeneratorTarget::GetType(this_00);
    if (-1 < (int)TVar3) {
      TVar3 = cmGeneratorTarget::GetType(this_00);
      if ((int)TVar3 < 4) {
        cmGeneratorTarget::GetLocationForBuild_abi_cxx11_(this_00);
        std::__cxx11::string::string
                  ((string *)&tLocation,
                   (string *)
                   &cmGeneratorTarget::GetLocationForBuild[abi:cxx11]()::location_abi_cxx11_);
        cmsys::SystemTools::GetFilenamePath(&depLocation,&tLocation);
        std::__cxx11::string::operator=((string *)&tLocation,(string *)&depLocation);
        std::__cxx11::string::~string((string *)&depLocation);
        cmsys::SystemTools::GetFilenamePath(&depLocation,dep);
        cmsys::SystemTools::CollapseFullPath(&local_40,&depLocation);
        std::__cxx11::string::operator=((string *)&depLocation,(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        cmsys::SystemTools::CollapseFullPath(&local_40,&tLocation);
        std::__cxx11::string::operator=((string *)&tLocation,(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        _Var2 = std::operator==(&depLocation,&tLocation);
        if (_Var2) {
          cmTarget::AddUtility(this->GeneratorTarget->Target,&util,false,(cmMakefile *)0x0);
          std::__cxx11::string::~string((string *)&depLocation);
          std::__cxx11::string::~string((string *)&tLocation);
          bVar1 = true;
          goto LAB_0033ca47;
        }
        std::__cxx11::string::~string((string *)&depLocation);
        std::__cxx11::string::~string((string *)&tLocation);
      }
    }
  }
  bVar1 = false;
LAB_0033ca47:
  std::__cxx11::string::~string((string *)&util);
  return bVar1;
}

Assistant:

bool cmTargetTraceDependencies::IsUtility(std::string const& dep)
{
  // Dependencies on targets (utilities) are supposed to be named by
  // just the target name.  However for compatibility we support
  // naming the output file generated by the target (assuming there is
  // no output-name property which old code would not have set).  In
  // that case the target name will be the file basename of the
  // dependency.
  std::string util = cmSystemTools::GetFilenameName(dep);
  if (cmSystemTools::GetFilenameLastExtension(util) == ".exe") {
    util = cmSystemTools::GetFilenameWithoutLastExtension(util);
  }

  // Check for a target with this name.
  if (cmGeneratorTarget* t =
        this->GeneratorTarget->GetLocalGenerator()->FindGeneratorTargetToUse(
          util)) {
    // If we find the target and the dep was given as a full path,
    // then make sure it was not a full path to something else, and
    // the fact that the name matched a target was just a coincidence.
    if (cmSystemTools::FileIsFullPath(dep)) {
      if (t->GetType() >= cmStateEnums::EXECUTABLE &&
          t->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        // This is really only for compatibility so we do not need to
        // worry about configuration names and output names.
        std::string tLocation = t->GetLocationForBuild();
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        std::string depLocation = cmSystemTools::GetFilenamePath(dep);
        depLocation = cmSystemTools::CollapseFullPath(depLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
        if (depLocation == tLocation) {
          this->GeneratorTarget->Target->AddUtility(util, false);
          return true;
        }
      }
    } else {
      // The original name of the dependency was not a full path.  It
      // must name a target, so add the target-level dependency.
      this->GeneratorTarget->Target->AddUtility(util, true);
      return true;
    }
  }

  // The dependency does not name a target built in this project.
  return false;
}